

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAdvancedBlendEquationTests.cpp
# Opt level: O0

ProgramSources *
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateProgramSources
          (ProgramSources *__return_storage_ptr__,NegativeTestContext *ctx,BlendEquation equation)

{
  ProgramSources *pPVar1;
  BlendEquation in_ECX;
  NegativeTestContext *ctx_00;
  string local_190;
  ShaderSource local_170;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_f0;
  BlendEquation local_1c;
  NegativeTestContext *pNStack_18;
  BlendEquation equation_local;
  NegativeTestContext *ctx_local;
  
  local_1c = equation;
  pNStack_18 = ctx;
  ctx_local = (NegativeTestContext *)__return_storage_ptr__;
  glu::ProgramSources::ProgramSources(&local_f0);
  NegativeTestShared::(anonymous_namespace)::generateVertexShaderSource_abi_cxx11_
            (&local_138,(_anonymous_namespace_ *)pNStack_18,ctx_00);
  glu::VertexSource::VertexSource((VertexSource *)&local_118,&local_138);
  pPVar1 = glu::ProgramSources::operator<<(&local_f0,&local_118);
  NegativeTestShared::(anonymous_namespace)::generateFragmentShaderSource_abi_cxx11_
            (&local_190,(_anonymous_namespace_ *)pNStack_18,(NegativeTestContext *)(ulong)local_1c,
             in_ECX);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_170,&local_190);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_170);
  glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar1);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  glu::VertexSource::~VertexSource((VertexSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  glu::ProgramSources::~ProgramSources(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

glu::ProgramSources generateProgramSources (NegativeTestContext& ctx, BlendEquation equation)
{
	return glu::ProgramSources()
		<< glu::VertexSource(generateVertexShaderSource(ctx))
		<< glu::FragmentSource(generateFragmentShaderSource(ctx, equation));
}